

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall chatra::RuntimeImp::initialize(RuntimeImp *this,uint initialThreadCount)

{
  element_type *dst;
  EVP_PKEY_CTX *src;
  undefined1 local_38 [36];
  uint local_14;
  RuntimeImp *pRStack_10;
  uint initialThreadCount_local;
  RuntimeImp *this_local;
  
  local_14 = initialThreadCount;
  pRStack_10 = this;
  registerEmbeddedClasses(&this->classes);
  registerEmbeddedFunctions(&this->methods,&this->operators);
  StringTable::newInstance();
  std::shared_ptr<chatra::StringTable>::operator=
            (&this->primarySTable,(shared_ptr<chatra::StringTable> *)(local_38 + 0x10));
  std::shared_ptr<chatra::StringTable>::~shared_ptr
            ((shared_ptr<chatra::StringTable> *)(local_38 + 0x10));
  dst = std::__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->primarySTable);
  StringTable::copy((StringTable *)local_38,(EVP_PKEY_CTX *)dst,src);
  std::shared_ptr<chatra::StringTable>::operator=
            (&this->distributedSTable,(shared_ptr<chatra::StringTable> *)local_38);
  std::shared_ptr<chatra::StringTable>::~shared_ptr((shared_ptr<chatra::StringTable> *)local_38);
  launchStorage(this);
  launchFinalizerThread(this);
  launchSystem(this,local_14);
  return;
}

Assistant:

void RuntimeImp::initialize(unsigned initialThreadCount) {
	registerEmbeddedClasses(classes);
	registerEmbeddedFunctions(methods, operators);

	primarySTable = StringTable::newInstance();
	distributedSTable = primarySTable->copy();

	launchStorage();
	launchFinalizerThread();
	launchSystem(initialThreadCount);
}